

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.h
# Opt level: O3

void __thiscall trun::TestResponseProxy::~TestResponseProxy(TestResponseProxy *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_TestResponseProxy = (_func_int **)&PTR__TestResponseProxy_001dad10;
  pcVar2 = (this->moduleName)._M_dataplus._M_p;
  paVar1 = &(this->moduleName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->symbolName)._M_dataplus._M_p;
  paVar1 = &(this->symbolName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->exceptionString)._M_dataplus._M_p;
  paVar1 = &(this->exceptionString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->assertError)._vptr_AssertError = (_func_int **)&PTR__AssertError_001dac38;
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  ~vector(&(this->assertError).assertErrors);
  return;
}

Assistant:

virtual ~TestResponseProxy() = default;